

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O1

int ya_getopt_internal(int argc,char **argv,char *optstring,option *longopts,int *longindex,
                      int long_only)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char **ppcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int long_only_flag;
  int local_34;
  
  if (ya_optopt == 0x3f) {
    ya_optopt = 0;
  }
  if (posixly_correct == -1) {
    cVar1 = *optstring;
    uVar12 = 1;
    if (cVar1 != '+') {
      pcVar3 = getenv("POSIXLY_CORRECT");
      uVar12 = (uint)(pcVar3 != (char *)0x0);
    }
    handle_nonopt_argv = cVar1 == '-';
    posixly_correct = uVar12;
  }
  if (ya_optind == 0) {
    cVar1 = *optstring;
    uVar12 = 1;
    if (cVar1 != '+') {
      pcVar3 = getenv("POSIXLY_CORRECT");
      uVar12 = (uint)(pcVar3 != (char *)0x0);
    }
    handle_nonopt_argv = cVar1 == '-';
    ya_optind = 1;
    ya_optnext = (char *)0x0;
    posixly_correct = uVar12;
  }
  pcVar3 = ya_optnext;
  if ((*optstring == '-') || (*optstring == '+')) {
    optstring = optstring + 1;
  }
  if (ya_getopt_internal::start != 0 && ya_optnext == (char *)0x0) {
    iVar8 = (ya_optind + ya_getopt_internal::start) - ya_getopt_internal::end;
    iVar11 = 1;
    if (1 < iVar8) {
      iVar11 = iVar8;
    }
    if (ya_getopt_internal::start < ya_getopt_internal::end) {
      iVar8 = ya_optind + -1;
      iVar10 = 1;
      uVar9 = (long)ya_getopt_internal::end - 1;
      ppcVar6 = argv;
      iVar7 = ya_optind;
      ya_optind = iVar11;
      do {
        iVar7 = iVar7 + -1;
        pcVar5 = argv[uVar9];
        iVar11 = (int)uVar9;
        lVar13 = (long)ya_getopt_internal::end;
        if ((long)uVar9 < (long)iVar7) {
          do {
            ppcVar6[lVar13 + -1] = ppcVar6[lVar13];
            lVar13 = lVar13 + 1;
          } while ((long)iVar8 + 1 != lVar13);
          iVar11 = (int)lVar13 - iVar10;
        }
        argv[iVar11] = pcVar5;
        uVar4 = uVar9 - 1;
        ppcVar6 = ppcVar6 + -1;
        iVar10 = iVar10 + 1;
        bVar2 = (long)ya_getopt_internal::start < (long)uVar9;
        uVar9 = uVar4;
      } while (bVar2);
    }
    else {
      uVar4 = (ulong)(ya_getopt_internal::end - 1);
      ya_optind = iVar11;
    }
    ya_getopt_internal::end = (int)uVar4;
    ya_getopt_internal::start = 0;
  }
  iVar11 = ya_optind;
  if (argc <= ya_optind) {
    ya_optarg = (char *)0x0;
    return -1;
  }
  if (pcVar3 != (char *)0x0) goto LAB_00104eda;
  pcVar3 = argv[ya_optind];
  if ((*pcVar3 == '-') && (pcVar3[1] != '\0')) {
LAB_00104d9c:
    iVar11 = strcmp(pcVar3,"--");
    if (iVar11 == 0) {
      ya_optind = ya_optind + 1;
LAB_00104eca:
      iVar11 = -1;
      goto LAB_00104ed0;
    }
    iVar11 = -1;
    bVar2 = true;
    if ((longopts != (option *)0x0) && (pcVar3[1] == '-')) {
      iVar11 = ya_getopt_longopts(argc,argv,argv[ya_optind] + 2,optstring,longopts,longindex,
                                  (int *)0x0);
      goto LAB_00104ed0;
    }
  }
  else {
    if (handle_nonopt_argv != '\x01') {
      if (posixly_correct == 0) {
        ya_getopt_internal::start = ya_optind;
        uVar4 = (long)ya_optind + 1;
        iVar8 = ya_getopt_internal::end;
        if ((int)uVar4 < argc) {
          ppcVar6 = argv + uVar4;
          do {
            if ((**ppcVar6 == '-') && (iVar8 = (int)uVar4, (*ppcVar6)[1] != '\0')) break;
            uVar12 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar12;
            ppcVar6 = ppcVar6 + 1;
            iVar8 = ya_getopt_internal::end;
          } while (argc != uVar12);
        }
        ya_getopt_internal::end = iVar8;
        iVar8 = (int)uVar4;
        if (iVar8 != argc) {
          pcVar3 = argv[iVar8];
          ya_optind = iVar8;
          ya_getopt_internal::start = iVar11;
          goto LAB_00104d9c;
        }
        ya_optarg = (char *)0x0;
      }
      else {
        ya_optarg = (char *)0x0;
      }
      goto LAB_00104eca;
    }
    ya_optind = ya_optind + 1;
    ya_getopt_internal::start = 0;
    iVar11 = 1;
    ya_optarg = pcVar3;
LAB_00104ed0:
    bVar2 = false;
  }
  if (!bVar2) {
    return iVar11;
  }
LAB_00104eda:
  if (ya_optnext == (char *)0x0) {
    ya_optnext = argv[ya_optind] + 1;
  }
  if (long_only != 0) {
    local_34 = 0;
    iVar11 = ya_getopt_longopts(argc,argv,ya_optnext,optstring,longopts,longindex,&local_34);
    if (local_34 == 0) {
      ya_optnext = (char *)0x0;
      return iVar11;
    }
  }
  pcVar3 = ya_optnext;
  uVar12 = (uint)*ya_optnext;
  pcVar5 = strchr(optstring,uVar12);
  if (pcVar5 == (char *)0x0) {
    ya_optarg = (char *)0x0;
    if (long_only != 0) {
      ya_getopt_error(optstring,"%s: unrecognized option \'-%s\'\n",*argv,pcVar3);
      ya_optind = ya_optind + 1;
      ya_optnext = (char *)0x0;
      return 0x3f;
    }
    ya_optopt = uVar12;
    ya_getopt_error(optstring,"%s: invalid option -- \'%c\'\n",*argv,(ulong)uVar12);
    uVar12 = 0x3f;
    if (ya_optnext[1] != '\0') {
      ya_optnext = ya_optnext + 1;
      return 0x3f;
    }
  }
  else {
    if (pcVar5[1] != ':') {
      if (pcVar3[1] == '\0') {
        ya_optind = ya_optind + 1;
        ya_optarg = (char *)0x0;
        ya_optnext = (char *)0x0;
        return uVar12;
      }
      ya_optarg = (char *)0x0;
      ya_optnext = pcVar3 + 1;
      return uVar12;
    }
    if (pcVar3[1] == '\0') {
      lVar13 = (long)ya_optind;
      iVar11 = ya_optind + 1;
      ya_optnext = (char *)0x0;
      if (pcVar5[2] == ':') {
        ya_optind = iVar11;
        ya_optarg = (char *)0x0;
        ya_optnext = (char *)0x0;
        return uVar12;
      }
      if (iVar11 != argc) {
        ya_optind = ya_optind + 2;
        ya_optarg = argv[lVar13 + 1];
        ya_optnext = (char *)0x0;
        return uVar12;
      }
      ya_optarg = (char *)0x0;
      ya_optind = iVar11;
      ya_optopt = uVar12;
      ya_getopt_error(optstring,"%s: option requires an argument -- \'%c\'\n",*argv,(ulong)uVar12);
      return (uint)(*optstring != ':') * 5 + 0x3a;
    }
    ya_optarg = pcVar3 + 1;
  }
  ya_optind = ya_optind + 1;
  ya_optnext = (char *)0x0;
  return uVar12;
}

Assistant:

static int ya_getopt_internal(int argc, char * const argv[], const char *optstring, const struct option *longopts, int *longindex, int long_only)
{
    static int start, end;

    if (ya_optopt == '?') {
        ya_optopt = 0;
    }

    if (posixly_correct == -1) {
        check_gnu_extension(optstring);
    }

    if (ya_optind == 0) {
        check_gnu_extension(optstring);
        ya_optind = 1;
        ya_optnext = NULL;
    }

    switch (optstring[0]) {
    case '+':
    case '-':
        optstring++;
    }

    if (ya_optnext == NULL && start != 0) {
        int last_pos = ya_optind - 1;

        ya_optind -= end - start;
        if (ya_optind <= 0) {
            ya_optind = 1;
        }
        while (start < end--) {
            int i;
            char *arg = argv[end];

            for (i = end; i < last_pos; i++) {
                ((char **)argv)[i] = argv[i + 1];
            }
            ((char const **)argv)[i] = arg;
            last_pos--;
        }
        start = 0;
    }

    if (ya_optind >= argc) {
        ya_optarg = NULL;
        return -1;
    }
    if (ya_optnext == NULL) {
        const char *arg = argv[ya_optind];
        if (!is_option(arg)) {
            if (handle_nonopt_argv) {
                ya_optarg = argv[ya_optind++];
                start = 0;
                return 1;
            } else if (posixly_correct) {
                ya_optarg = NULL;
                return -1;
            } else {
                int i;

                start = ya_optind;
                for (i = ya_optind + 1; i < argc; i++) {
                    if (is_option(argv[i])) {
                        end = i;
                        break;
                    }
                }
                if (i == argc) {
                    ya_optarg = NULL;
                    return -1;
                }
                ya_optind = i;
                arg = argv[ya_optind];
            }
        }
        if (strcmp(arg, "--") == 0) {
            ya_optind++;
            return -1;
        }
        if (longopts != NULL && arg[1] == '-') {
            return ya_getopt_longopts(argc, argv, argv[ya_optind] + 2, optstring, longopts, longindex, NULL);
        }
    }

    if (ya_optnext == NULL) {
        ya_optnext = argv[ya_optind] + 1;
    }
    if (long_only) {
        int long_only_flag = 0;
        int rv = ya_getopt_longopts(argc, argv, ya_optnext, optstring, longopts, longindex, &long_only_flag);
        if (!long_only_flag) {
            ya_optnext = NULL;
            return rv;
        }
    }

    return ya_getopt_shortopts(argc, argv, optstring, long_only);
}